

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int xmlXPathPopBoolean(xmlXPathParserContextPtr ctxt)

{
  int iVar1;
  xmlXPathObjectPtr val;
  
  val = valuePop(ctxt);
  if (val == (xmlXPathObjectPtr)0x0) {
    xmlXPathErr(ctxt,10);
    iVar1 = 0;
    if (ctxt != (xmlXPathParserContextPtr)0x0) {
      ctxt->error = 10;
    }
  }
  else {
    if (val->type == XPATH_BOOLEAN) {
      iVar1 = val->boolval;
    }
    else {
      iVar1 = xmlXPathCastToBoolean(val);
    }
    xmlXPathReleaseObject(ctxt->context,val);
  }
  return iVar1;
}

Assistant:

int
xmlXPathPopBoolean (xmlXPathParserContextPtr ctxt) {
    xmlXPathObjectPtr obj;
    int ret;

    obj = valuePop(ctxt);
    if (obj == NULL) {
	xmlXPathSetError(ctxt, XPATH_INVALID_OPERAND);
	return(0);
    }
    if (obj->type != XPATH_BOOLEAN)
	ret = xmlXPathCastToBoolean(obj);
    else
        ret = obj->boolval;
    xmlXPathReleaseObject(ctxt->context, obj);
    return(ret);
}